

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

bool __thiscall
soplex::SPxBasisBase<double>::readBasis
          (SPxBasisBase<double> *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  double *pdVar1;
  double dVar2;
  NameSet *pNVar3;
  char *__s1;
  bool bVar4;
  Status SVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Type TVar9;
  SPxSolverBase<double> *pSVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  Desc l_desc;
  DataKey key;
  MPSInput mps;
  NameSet *local_440;
  NameSet *local_438;
  double local_430;
  Desc local_428;
  DataKey local_3e8;
  DataKey local_3e0;
  NameSet *local_3d8;
  NameSet *local_3d0;
  NameSet *local_3c8;
  istream *local_3c0;
  double local_3b8;
  undefined8 uStack_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [16];
  istream *local_380;
  undefined8 local_378;
  undefined2 local_370;
  ios_base local_310 [168];
  char *local_268;
  char *pcStack_260;
  char *local_258;
  char *pcStack_250;
  char *local_248;
  char *pcStack_240;
  char local_238;
  char local_138;
  undefined2 local_38;
  int local_34;
  
  local_438 = (NameSet *)0x0;
  local_440 = (NameSet *)0x0;
  local_3d8 = colNames;
  local_3d0 = rowNames;
  local_3c8 = colNames;
  local_3c0 = is;
  if (colNames == (NameSet *)0x0) {
    uVar7 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    spx_alloc<soplex::NameSet*>(&local_438,1);
    pNVar3 = local_438;
    NameSet::NameSet(local_438,10000,-1,2.0,2.0);
    local_438 = pNVar3;
    NameSet::reMax(pNVar3,uVar7);
    if (0 < (int)uVar7) {
      uVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_380,"x",1);
        std::ostream::operator<<((ostream *)&local_380,(int)uVar11);
        local_3e0 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thekey[uVar11];
        SPxColId::SPxColId((SPxColId *)&local_428,&local_3e0);
        pNVar3 = local_438;
        local_3e8.info = local_428.rowstat.thesize;
        local_3e8.idx = local_428.rowstat.themax;
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar3,&local_3e8,(char *)local_428.rowstat._0_8_);
        rowNames = local_3d0;
        if ((DataKey *)local_428.rowstat._0_8_ != (DataKey *)&local_428.rowstat.memFactor) {
          operator_delete((void *)local_428.rowstat._0_8_,(long)local_428.rowstat.memFactor + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    local_3d8 = local_438;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
    std::ios_base::~ios_base(local_310);
  }
  if (rowNames == (NameSet *)0x0) {
    uVar7 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    spx_alloc<soplex::NameSet*>(&local_440,1);
    pNVar3 = local_440;
    NameSet::NameSet(local_440,10000,-1,2.0,2.0);
    local_440 = pNVar3;
    NameSet::reMax(pNVar3,uVar7);
    if (0 < (int)uVar7) {
      uVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_380,"C",1);
        std::ostream::operator<<((ostream *)&local_380,(int)uVar11);
        local_3e0 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thekey[uVar11];
        SPxRowId::SPxRowId((SPxRowId *)&local_428,&local_3e0);
        pNVar3 = local_440;
        local_3e8.info = local_428.rowstat.thesize;
        local_3e8.idx = local_428.rowstat.themax;
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar3,&local_3e8,(char *)local_428.rowstat._0_8_);
        if ((DataKey *)local_428.rowstat._0_8_ != (DataKey *)&local_428.rowstat.memFactor) {
          operator_delete((void *)local_428.rowstat._0_8_,(long)local_428.rowstat.memFactor + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    rowNames = local_440;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
    std::ios_base::~ios_base(local_310);
  }
  if (this->thestatus == NO_PROBLEM) {
    (*this->_vptr_SPxBasisBase[7])(this,this->theLP,0);
  }
  Desc::Desc(&local_428,&this->thedesc);
  if (0 < (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          set.thenum) {
    lVar12 = 0;
    do {
      SVar5 = dualRowStatus(this,(int)lVar12);
      local_428.rowstat.data[lVar12] = SVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  pSVar10 = this->theLP;
  if (0 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    local_3a8 = *(double *)(in_FS_OFFSET + -8);
    uStack_3a0 = 0;
    local_3b8 = -local_3a8;
    uStack_3b0 = 0x8000000000000000;
    lVar12 = 0;
    do {
      dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar12];
      SVar5 = P_FIXED;
      pdVar1 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar12;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_430 = dVar2;
        ::soplex::infinity::__tls_init();
        if (local_430 <= local_3b8) {
          local_430 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12];
          ::soplex::infinity::__tls_init();
          SVar5 = P_FREE;
          if (local_3a8 <= local_430) goto LAB_001c4a82;
        }
        local_430 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
        ::soplex::infinity::__tls_init();
        SVar5 = (uint)(local_430 <= local_3b8) * 2 | P_ON_LOWER;
      }
LAB_001c4a82:
      local_428.colstat.data[lVar12] = SVar5;
      lVar12 = lVar12 + 1;
      pSVar10 = this->theLP;
    } while (lVar12 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  local_390._0_8_ = &PTR__MPSInput_006a9fa8;
  local_390._8_4_ = NAME;
  local_380 = local_3c0;
  local_378._0_4_ = 0;
  local_378._4_4_ = MINIMIZE;
  local_370._0_1_ = false;
  local_370._1_1_ = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138 = '\0';
  local_268 = (char *)0x0;
  pcStack_260 = (char *)0x0;
  local_258 = (char *)0x0;
  pcStack_250 = (char *)0x0;
  local_248 = (char *)0x0;
  pcStack_240 = (char *)0x0;
  local_238 = '\0';
  bVar4 = MPSInput::readLine((MPSInput *)local_390);
  if (((bVar4) && (local_268 != (char *)0x0)) && (iVar6 = strcmp(local_268,"NAME"), iVar6 == 0)) {
    while (bVar4 = MPSInput::readLine((MPSInput *)local_390), bVar4) {
      if ((local_268 != (char *)0x0) && (iVar6 = strcmp(local_268,"ENDATA"), iVar6 == 0)) {
        local_390._8_4_ = ENDATA;
        break;
      }
      if ((((pcStack_260 == (char *)0x0) || (local_258 == (char *)0x0)) ||
          (uVar7 = NameSet::number(local_3d8,local_258), (int)uVar7 < 0)) ||
         ((iVar6 = -1, *pcStack_260 == 'X' &&
          ((pcStack_250 == (char *)0x0 || (iVar6 = NameSet::number(rowNames,pcStack_250), iVar6 < 0)
           ))))) break;
      __s1 = pcStack_260;
      iVar8 = strcmp(pcStack_260,"XU");
      if (iVar8 == 0) {
        SVar5 = dualColStatus(this,uVar7);
        local_428.colstat.data[uVar7] = SVar5;
        TVar9 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,iVar6);
        if (TVar9 == GREATER_EQUAL) {
          local_428.rowstat.data[iVar6] = P_ON_LOWER;
        }
        else {
          TVar9 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,iVar6);
          if (TVar9 == EQUAL) goto LAB_001c4d19;
          local_428.rowstat.data[iVar6] = P_ON_UPPER;
        }
      }
      else {
        iVar8 = strcmp(__s1,"XL");
        if (iVar8 == 0) {
          SVar5 = dualColStatus(this,uVar7);
          local_428.colstat.data[uVar7] = SVar5;
          TVar9 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,iVar6);
          if (TVar9 == LESS_EQUAL) {
            local_428.rowstat.data[iVar6] = P_ON_UPPER;
          }
          else {
            TVar9 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,iVar6);
            if (TVar9 == EQUAL) {
LAB_001c4d19:
              local_428.rowstat.data[iVar6] = P_FIXED;
            }
            else {
              local_428.rowstat.data[iVar6] = P_ON_LOWER;
            }
          }
        }
        else {
          iVar6 = strcmp(__s1,"UL");
          if (iVar6 == 0) {
            local_428.colstat.data[uVar7] = P_ON_UPPER;
          }
          else {
            iVar6 = strcmp(__s1,"LL");
            if (iVar6 != 0) {
              MPSInput::syntaxError((MPSInput *)local_390);
              break;
            }
            local_428.colstat.data[uVar7] = P_ON_LOWER;
          }
        }
      }
    }
  }
  if (local_370._0_1_ == false) {
    if (local_390._8_4_ == ENDATA) {
      if (this->thestatus != REGULAR) {
        this->thestatus = REGULAR;
      }
      (*this->_vptr_SPxBasisBase[5])(this,(DataKey *)&local_428);
    }
    else {
      MPSInput::syntaxError((MPSInput *)local_390);
    }
  }
  if (local_3d0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_440);
    free(local_440);
    local_440 = (NameSet *)0x0;
  }
  if (local_3c8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_438);
    free(local_438);
    local_438 = (NameSet *)0x0;
  }
  bVar4 = local_370._0_1_;
  local_390._0_8_ = &PTR__MPSInput_006a9fa8;
  local_248 = (char *)0x0;
  pcStack_240 = (char *)0x0;
  local_258 = (char *)0x0;
  pcStack_250 = (char *)0x0;
  local_268 = (char *)0x0;
  pcStack_260 = (char *)0x0;
  if (local_428.colstat.data != (Status *)0x0) {
    free(local_428.colstat.data);
    local_428.colstat.data = (Status *)0x0;
  }
  if (local_428.rowstat.data != (Status *)0x0) {
    free(local_428.rowstat.data);
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}